

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O2

bool readFileIntoBuffer(CBString *inPath,UByteArray *buf)

{
  bool bVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  vector<char,_std::allocator<char>_> buffer;
  UByteArray local_238;
  ifstream inputFile;
  byte abStack_1f8 [200];
  undefined8 auStack_130 [36];
  
  bVar1 = isExistOnFs(inPath);
  if (bVar1) {
    std::ifstream::ifstream(&inputFile,(char *)(inPath->super_tagbstring).data,_S_in|_S_bin);
    bVar1 = (abStack_1f8[*(long *)(_inputFile + -0x18)] & 5) == 0;
    if (bVar1) {
      __first._8_8_ = 0xffffffffffffffff;
      __first._M_sbuf = *(streambuf_type **)((long)auStack_130 + *(long *)(_inputFile + -0x18));
      std::vector<char,std::allocator<char>>::
      vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                ((vector<char,std::allocator<char>> *)&buffer,__first,
                 (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
                 (allocator_type *)&local_238);
      std::ifstream::close();
      UByteArray::UByteArray(&local_238,&buffer);
      std::__cxx11::string::_M_assign((string *)buf);
      std::__cxx11::string::~string((string *)&local_238);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buffer.super__Vector_base<char,_std::allocator<char>_>);
    }
    std::ifstream::~ifstream(&inputFile);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool readFileIntoBuffer(const UString& inPath, UByteArray& buf) 
{
    if (!isExistOnFs(inPath))
        return false;

    std::ifstream inputFile(inPath.toLocal8Bit(), std::ios::in | std::ios::binary);
    if (!inputFile)
        return false;
    std::vector<char> buffer(std::istreambuf_iterator<char>(inputFile),
        (std::istreambuf_iterator<char>()));
    inputFile.close();

    buf = buffer;

    return true;
}